

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_factorization.cc
# Opt level: O0

void __thiscall
ipx::LuFactorization::Factorize
          (LuFactorization *this,Int dim,Int *Bbegin,Int *Bend,Int *Bi,double *Bx,double pivottol,
          bool strict_abs_pivottol,SparseMatrix *L,SparseMatrix *U,
          vector<int,_std::allocator<int>_> *rowperm,vector<int,_std::allocator<int>_> *colperm,
          vector<int,_std::allocator<int>_> *dependent_cols)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  double dVar1;
  byte in_stack_00000008;
  Int *in_stack_000000d0;
  vector<int,_std::allocator<int>_> *in_stack_000000e0;
  vector<int,_std::allocator<int>_> *in_stack_000000e8;
  vector<int,_std::allocator<int>_> *in_stack_000000f0;
  
  (**(code **)(*in_RDI + 0x10))
            (in_XMM0_Qa,in_RDI,in_ESI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008 & 1);
  dVar1 = StabilityEstimate(in_stack_000000d0,(Int *)dependent_cols,(Int *)colperm,(double *)rowperm
                            ,U,L,in_stack_000000e0,in_stack_000000e8,in_stack_000000f0);
  in_RDI[1] = (long)dVar1;
  return;
}

Assistant:

void LuFactorization::Factorize(Int dim, const Int* Bbegin, const Int* Bend,
                                const Int* Bi, const double* Bx,
                                double pivottol, bool strict_abs_pivottol,
                                SparseMatrix* L, SparseMatrix* U,
                                std::vector<Int>* rowperm,
                                std::vector<Int>* colperm,
                                std::vector<Int>* dependent_cols) {
    _Factorize(dim, Bbegin, Bend, Bi, Bx, pivottol, strict_abs_pivottol,
               L, U, rowperm, colperm, dependent_cols);
    stability_ = StabilityEstimate(Bbegin, Bend, Bi, Bx, *L, *U, *rowperm,
                                   *colperm, *dependent_cols);
}